

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O0

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceIntegration>::Holder
          (Holder<(anonymous_namespace)::Q_QGS_deviceIntegration> *this)

{
  Holder<(anonymous_namespace)::Q_QGS_deviceIntegration> *in_RDI;
  char newValue;
  
  pointer(in_RDI);
  newValue = (char)((ulong)in_RDI >> 0x38);
  anon_unknown.dwarf_236cb::Q_QGS_deviceIntegration::innerFunction((void *)0x11ed66);
  QBasicAtomicInteger<signed_char>::storeRelaxed
            ((QBasicAtomicInteger<signed_char> *)&this->storage,newValue);
  return;
}

Assistant:

Holder() noexcept(ConstructionIsNoexcept)
    {
        QGS::innerFunction(pointer());
        guard.storeRelaxed(QtGlobalStatic::Initialized);
    }